

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void ConvertBGRAToRGB565_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 *puVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i *out;
  int iVar33;
  __m128i *in;
  undefined1 auVar34 [15];
  undefined1 auVar35 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [12];
  undefined1 auVar54 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar37 [16];
  undefined1 auVar46 [16];
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar41 [16];
  undefined1 auVar50 [16];
  undefined1 auVar42 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar53 [14];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  auVar32 = _DAT_0018ada0;
  auVar31 = _DAT_0018ad90;
  auVar30 = _DAT_0018ad80;
  iVar33 = num_pixels;
  if (7 < num_pixels) {
    do {
      auVar43 = *(undefined1 (*) [16])src;
      pauVar1 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar16 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar17 = (undefined1 (*) [16])((long)src + 0x10);
      uVar4 = (*(undefined1 (*) [16])((long)src + 0x10))[3];
      pauVar18 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar19 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar20 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar21 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar22 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar23 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar24 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar25 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar26 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar27 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar28 = (undefined1 (*) [16])((long)src + 0x10);
      pauVar29 = (undefined1 (*) [16])((long)src + 0x10);
      src = (uint32_t *)((long)src + 0x20);
      auVar71._0_14_ = auVar43._0_14_;
      auVar71[0xe] = auVar43[7];
      auVar71[0xf] = (*pauVar21)[7];
      auVar70._14_2_ = auVar71._14_2_;
      auVar70._0_13_ = auVar43._0_13_;
      auVar70[0xd] = (*pauVar20)[6];
      auVar69._13_3_ = auVar70._13_3_;
      auVar69._0_12_ = auVar43._0_12_;
      auVar69[0xc] = auVar43[6];
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._0_11_ = auVar43._0_11_;
      auVar68[0xb] = (*pauVar19)[5];
      auVar67._11_5_ = auVar68._11_5_;
      auVar67._0_10_ = auVar43._0_10_;
      auVar67[10] = auVar43[5];
      auVar66._10_6_ = auVar67._10_6_;
      auVar66._0_9_ = auVar43._0_9_;
      auVar66[9] = (*pauVar18)[4];
      auVar65._9_7_ = auVar66._9_7_;
      auVar65._0_8_ = auVar43._0_8_;
      auVar65[8] = auVar43[4];
      auVar9._1_8_ = auVar65._8_8_;
      auVar9[0] = uVar4;
      auVar9._9_7_ = 0;
      auVar8._10_6_ = 0;
      auVar8._0_10_ = SUB1610(auVar9 << 0x38,6);
      auVar7._11_5_ = 0;
      auVar7._0_11_ = SUB1611(auVar8 << 0x30,5);
      auVar6._12_4_ = 0;
      auVar6._0_12_ = SUB1612(auVar7 << 0x28,4);
      auVar5._13_3_ = 0;
      auVar5._0_13_ = SUB1613(auVar6 << 0x20,3);
      auVar73._14_2_ = 0;
      auVar73._0_14_ = SUB1614(auVar5 << 0x18,2);
      auVar73 = auVar73 << 0x10;
      auVar61._0_14_ = auVar73._0_14_;
      auVar61[0xe] = uVar4;
      auVar61[0xf] = (*pauVar25)[0xb];
      auVar60._14_2_ = auVar61._14_2_;
      auVar60._0_13_ = auVar73._0_13_;
      auVar60[0xd] = auVar43[0xb];
      auVar59._13_3_ = auVar60._13_3_;
      auVar59._0_12_ = auVar73._0_12_;
      auVar59[0xc] = auVar43[3];
      auVar58._12_4_ = auVar59._12_4_;
      auVar58._0_11_ = auVar73._0_11_;
      auVar58[0xb] = (*pauVar24)[10];
      auVar57._11_5_ = auVar58._11_5_;
      auVar57._0_10_ = auVar73._0_10_;
      auVar57[10] = (*pauVar17)[2];
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_9_ = auVar73._0_9_;
      auVar56[9] = auVar43[10];
      auVar55._9_7_ = auVar56._9_7_;
      auVar55._0_8_ = auVar73._0_8_;
      auVar55[8] = auVar43[2];
      auVar14._1_8_ = auVar55._8_8_;
      auVar14[0] = (*pauVar23)[9];
      auVar14._9_7_ = 0;
      auVar13._10_6_ = 0;
      auVar13._0_10_ = SUB1610(auVar14 << 0x38,6);
      auVar12._11_5_ = 0;
      auVar12._0_11_ = SUB1611(auVar13 << 0x30,5);
      auVar11._12_4_ = 0;
      auVar11._0_12_ = SUB1612(auVar12 << 0x28,4);
      auVar10._13_3_ = 0;
      auVar10._0_13_ = SUB1613(auVar11 << 0x20,3);
      auVar54._14_2_ = 0;
      auVar54._0_14_ = SUB1614(auVar10 << 0x18,2);
      auVar54 = auVar54 << 0x10;
      auVar42._0_14_ = auVar54._0_14_;
      auVar42[0xe] = (*pauVar23)[9];
      auVar42[0xf] = (*pauVar27)[0xd];
      auVar41._14_2_ = auVar42._14_2_;
      auVar41._0_13_ = auVar54._0_13_;
      auVar41[0xd] = (*pauVar19)[5];
      auVar40._13_3_ = auVar41._13_3_;
      auVar40._0_12_ = auVar54._0_12_;
      auVar40[0xc] = (*pauVar16)[1];
      auVar39._12_4_ = auVar40._12_4_;
      auVar39._0_11_ = auVar54._0_11_;
      auVar39[0xb] = auVar43[0xd];
      auVar38._11_5_ = auVar39._11_5_;
      auVar38._0_10_ = auVar54._0_10_;
      auVar38[10] = auVar43[9];
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_9_ = auVar54._0_9_;
      auVar37[9] = auVar43[5];
      auVar36._9_7_ = auVar37._9_7_;
      auVar36._0_8_ = auVar54._0_8_;
      auVar36[8] = auVar43[1];
      auVar35._8_8_ = auVar36._8_8_;
      auVar35[7] = (*pauVar26)[0xc];
      auVar35[6] = (*pauVar22)[8];
      auVar35[5] = (*pauVar18)[4];
      auVar35[4] = (*pauVar1)[0];
      auVar35[3] = auVar43[0xc];
      auVar35[2] = auVar43[8];
      auVar35[1] = auVar43[4];
      auVar35[0] = auVar43[0];
      auVar63._0_8_ =
           CONCAT17((*pauVar28)[0xe],
                    CONCAT16((*pauVar24)[10],
                             CONCAT15((*pauVar20)[6],
                                      CONCAT14((*pauVar17)[2],
                                               CONCAT13(auVar43[0xe],
                                                        CONCAT12(auVar43[10],
                                                                 CONCAT11(auVar43[6],auVar43[2])))))
                            ));
      auVar52._0_10_ = CONCAT19(auVar43[7],CONCAT18(auVar43[3],auVar63._0_8_));
      auVar52[10] = auVar43[0xb];
      auVar52[0xb] = auVar43[0xf];
      auVar53[0xc] = uVar4;
      auVar53._0_12_ = auVar52;
      auVar53[0xd] = (*pauVar21)[7];
      auVar62[0xe] = (*pauVar25)[0xb];
      auVar62._0_14_ = auVar53;
      auVar62[0xf] = (*pauVar29)[0xf];
      auVar72._8_8_ = auVar62._8_8_;
      auVar72._0_8_ = auVar35._8_8_;
      auVar63._8_8_ = auVar35._0_8_;
      auVar63 = auVar63 & auVar30;
      auVar43._0_2_ = auVar36._8_2_ >> 5;
      auVar43._2_2_ = auVar38._10_2_ >> 5;
      auVar43._4_2_ = auVar40._12_2_ >> 5;
      auVar43._6_2_ = auVar41._14_2_ >> 5;
      auVar43._8_2_ = (ushort)((unkuint10)auVar52._0_10_ >> 0x45);
      auVar43._10_2_ = auVar52._10_2_ >> 5;
      auVar43._12_2_ = auVar53._12_2_ >> 5;
      auVar43._14_2_ = auVar62._14_2_ >> 5;
      auVar73 = psllw(auVar72,3);
      auVar34 = auVar43._0_15_ & auVar31._0_15_ | auVar63._0_15_;
      auVar64._0_2_ = auVar63._8_2_ >> 3;
      auVar64._2_2_ = auVar63._10_2_ >> 3;
      auVar64._4_2_ = auVar63._12_2_ >> 3;
      auVar64._6_2_ = auVar63._14_2_ >> 3;
      auVar64._8_8_ = 0;
      auVar64 = auVar64 | auVar73 & auVar32;
      auVar51._0_14_ = auVar34._0_14_;
      auVar51[0xe] = auVar34[7];
      auVar51[0xf] = auVar64[7];
      auVar50._14_2_ = auVar51._14_2_;
      auVar50._0_13_ = auVar34._0_13_;
      auVar50[0xd] = auVar64[6];
      auVar49._13_3_ = auVar50._13_3_;
      auVar49._0_12_ = auVar34._0_12_;
      auVar49[0xc] = auVar34[6];
      auVar48._12_4_ = auVar49._12_4_;
      auVar48._0_11_ = auVar34._0_11_;
      auVar48[0xb] = auVar64[5];
      auVar47._11_5_ = auVar48._11_5_;
      auVar47._0_10_ = auVar34._0_10_;
      auVar47[10] = auVar34[5];
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_9_ = auVar34._0_9_;
      auVar46[9] = auVar64[4];
      auVar45._9_7_ = auVar46._9_7_;
      auVar45._0_8_ = auVar34._0_8_;
      auVar45[8] = auVar34[4];
      auVar44._8_8_ = auVar45._8_8_;
      auVar44[7] = auVar64[3];
      auVar44[6] = auVar34[3];
      auVar44[5] = auVar64[2];
      auVar44[4] = auVar34[2];
      auVar44[3] = auVar64[1];
      auVar44[2] = auVar34[1];
      auVar44[0] = auVar34[0];
      auVar44[1] = auVar64[0];
      *(undefined1 (*) [16])dst = auVar44;
      dst = (uint8_t *)((long)dst + 0x10);
      num_pixels = iVar33 + -8;
      bVar3 = 0xf < iVar33;
      iVar33 = num_pixels;
    } while (bVar3);
  }
  if (0 < num_pixels) {
    if (0 < num_pixels) {
      puVar15 = *(undefined1 (*) [16])src;
      do {
        uVar2 = *(uint *)*(undefined1 (*) [16])src;
        src = (uint32_t *)(*(undefined1 (*) [16])src + 4);
        (*(undefined1 (*) [16])dst)[0] = (byte)(uVar2 >> 0xd) & 7 | (byte)(uVar2 >> 0x10) & 0xf8;
        (*(undefined1 (*) [16])dst)[1] = (byte)(uVar2 >> 3) & 0x1f | (byte)(uVar2 >> 5) & 0xe0;
        dst = *(undefined1 (*) [16])dst + 2;
      } while (src < (undefined1 (*) [16])(puVar15 + (long)num_pixels * 4));
    }
    return;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGB565_SSE2(const uint32_t* WEBP_RESTRICT src,
                                     int num_pixels,
                                     uint8_t* WEBP_RESTRICT dst) {
  const __m128i mask_0xe0 = _mm_set1_epi8((char)0xe0);
  const __m128i mask_0xf8 = _mm_set1_epi8((char)0xf8);
  const __m128i mask_0x07 = _mm_set1_epi8(0x07);
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;
  while (num_pixels >= 8) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i v0l = _mm_unpacklo_epi8(bgra0, bgra4);  // b0b4g0g4r0r4a0a4...
    const __m128i v0h = _mm_unpackhi_epi8(bgra0, bgra4);  // b2b6g2g6r2r6a2a6...
    const __m128i v1l = _mm_unpacklo_epi8(v0l, v0h);      // b0b2b4b6g0g2g4g6...
    const __m128i v1h = _mm_unpackhi_epi8(v0l, v0h);      // b1b3b5b7g1g3g5g7...
    const __m128i v2l = _mm_unpacklo_epi8(v1l, v1h);      // b0...b7 | g0...g7
    const __m128i v2h = _mm_unpackhi_epi8(v1l, v1h);      // r0...r7 | a0...a7
    const __m128i ga0 = _mm_unpackhi_epi64(v2l, v2h);     // g0...g7 | a0...a7
    const __m128i rb0 = _mm_unpacklo_epi64(v2h, v2l);     // r0...r7 | b0...b7
    const __m128i rb1 = _mm_and_si128(rb0, mask_0xf8);    // -r0..-r7|-b0..-b7
    const __m128i g_lo1 = _mm_srli_epi16(ga0, 5);
    const __m128i g_lo2 = _mm_and_si128(g_lo1, mask_0x07);  // g0-...g7-|xx (3b)
    const __m128i g_hi1 = _mm_slli_epi16(ga0, 3);
    const __m128i g_hi2 = _mm_and_si128(g_hi1, mask_0xe0);  // -g0...-g7|xx (3b)
    const __m128i b0 = _mm_srli_si128(rb1, 8);              // -b0...-b7|0
    const __m128i rg1 = _mm_or_si128(rb1, g_lo2);           // gr0...gr7|xx
    const __m128i b1 = _mm_srli_epi16(b0, 3);
    const __m128i gb1 = _mm_or_si128(b1, g_hi2);            // bg0...bg7|xx
#if (WEBP_SWAP_16BIT_CSP == 1)
    const __m128i rgba = _mm_unpacklo_epi8(gb1, rg1);     // rggb0...rggb7
#else
    const __m128i rgba = _mm_unpacklo_epi8(rg1, gb1);     // bgrb0...bgrb7
#endif
    _mm_storeu_si128(out++, rgba);
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB565_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}